

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O2

void __thiscall RenX::Server::sendPubChan(Server *this,string_view msg)

{
  long lVar1;
  undefined8 uVar2;
  size_t sVar3;
  size_t i_1;
  size_t i;
  long lVar4;
  string message;
  string_view prefix;
  string_view msg_local;
  
  sVar3 = msg._M_len;
  msg_local._M_len = sVar3;
  msg_local._M_str = msg._M_str;
  prefix = getPrefix(this);
  if (prefix._M_len == 0) {
    lVar4 = 0;
    while( true ) {
      lVar1 = ServerManager::size();
      if (lVar4 == lVar1) break;
      uVar2 = ServerManager::getServer(_serverManager);
      Jupiter::IRC::Client::messageChannels(uVar2,this->m_logChanType,sVar3,msg._M_str);
      lVar4 = lVar4 + 1;
    }
  }
  else {
    message._M_dataplus._M_p = (pointer)&message.field_2;
    message._M_string_length = 0;
    message.field_2._M_local_buf[0] = '\0';
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
              (&message,prefix._M_len + sVar3 + 1);
    std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&message,&prefix);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&message,' ');
    std::__cxx11::string::append<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)&message,&msg_local);
    lVar4 = 0;
    while( true ) {
      lVar1 = ServerManager::size();
      if (lVar4 == lVar1) break;
      uVar2 = ServerManager::getServer(_serverManager);
      Jupiter::IRC::Client::messageChannels
                (uVar2,this->m_logChanType,message._M_string_length,message._M_dataplus._M_p);
      lVar4 = lVar4 + 1;
    }
    std::__cxx11::string::~string((string *)&message);
  }
  return;
}

Assistant:

void RenX::Server::sendPubChan(std::string_view msg) const {
	std::string_view prefix = getPrefix();
	if (!prefix.empty()) {
		std::string message;
		message.reserve(msg.size() + prefix.size() + 1);
		message = prefix;
		message += ' ';
		message += msg;
		for (size_t i = 0; i != serverManager->size(); i++) {
			serverManager->getServer(i)->messageChannels(m_logChanType, message);
		}

		return;
	}

	for (size_t i = 0; i != serverManager->size(); i++) {
		serverManager->getServer(i)->messageChannels(m_logChanType, msg);
	}
}